

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O2

void __thiscall Assimp::glTF2Exporter::ExportAnimations(glTF2Exporter *this)

{
  aiAnimation *paVar1;
  aiNodeAnim *nodeChannel;
  ulong uVar2;
  float ticksPerSecond;
  Ref<glTF2::Animation> RVar3;
  Ref<glTF2::Node> RVar4;
  Ref<glTF2::Node> local_120;
  Ref<glTF2::Animation> local_110;
  ulong local_100;
  Ref<glTF2::Buffer> local_f8;
  Sampler rotationSampler;
  Sampler translationSampler;
  Sampler scaleSampler;
  string nameAnim;
  string name;
  
  local_f8.vector =
       &(((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        buffers).mObjs;
  local_f8.index = 0;
  local_100 = 0;
  while( true ) {
    if (this->mScene->mNumAnimations <= local_100) break;
    paVar1 = this->mScene->mAnimations[local_100];
    ticksPerSecond = (float)paVar1->mTicksPerSecond;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameAnim,"anim",(allocator<char> *)&translationSampler);
    if ((paVar1->mName).length != 0) {
      std::__cxx11::string::assign((char *)&nameAnim);
    }
    for (uVar2 = 0; uVar2 < paVar1->mNumChannels; uVar2 = uVar2 + 1) {
      nodeChannel = paVar1->mChannels[uVar2];
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &translationSampler,&nameAnim,"_");
      to_string<unsigned_int>((string *)&rotationSampler,(uint)uVar2);
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &translationSampler,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rotationSampler);
      std::__cxx11::string::~string((string *)&rotationSampler);
      std::__cxx11::string::~string((string *)&translationSampler);
      glTF2::Asset::FindUniqueID
                ((string *)&translationSampler,
                 (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &name,"animation");
      std::__cxx11::string::operator=((string *)&name,(string *)&translationSampler);
      std::__cxx11::string::~string((string *)&translationSampler);
      RVar3 = glTF2::LazyDict<glTF2::Animation>::Create
                        (&((this->mAsset).
                           super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          animations,name._M_dataplus._M_p);
      local_110.vector = RVar3.vector;
      local_110.index = RVar3.index;
      RVar4 = glTF2::LazyDict<glTF2::Node>::Get
                        (&((this->mAsset).
                           super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          nodes,(nodeChannel->mNodeName).data);
      local_120.vector = RVar4.vector;
      translationSampler.input.vector =
           (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0;
      translationSampler.input.index = 0;
      translationSampler.output.vector =
           (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0;
      local_120.index = RVar4.index;
      translationSampler.output.index = 0;
      translationSampler.interpolation = Interpolation_LINEAR;
      ExtractTranslationSampler
                ((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &name,&local_f8,nodeChannel,ticksPerSecond,&translationSampler);
      AddSampler(&local_110,&local_120,&translationSampler,AnimationPath_TRANSLATION);
      rotationSampler.input.vector =
           (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0;
      rotationSampler.input.index = 0;
      rotationSampler.output.vector =
           (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0;
      rotationSampler.output.index = 0;
      rotationSampler.interpolation = Interpolation_LINEAR;
      ExtractRotationSampler
                ((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &name,&local_f8,nodeChannel,ticksPerSecond,&rotationSampler);
      AddSampler(&local_110,&local_120,&rotationSampler,AnimationPath_ROTATION);
      scaleSampler.input.vector =
           (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0;
      scaleSampler.input.index = 0;
      scaleSampler.output.vector =
           (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0;
      scaleSampler.output.index = 0;
      scaleSampler.interpolation = Interpolation_LINEAR;
      ExtractScaleSampler((this->mAsset).
                          super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&name,
                          &local_f8,nodeChannel,ticksPerSecond,&scaleSampler);
      AddSampler(&local_110,&local_120,&scaleSampler,AnimationPath_SCALE);
      std::__cxx11::string::~string((string *)&name);
    }
    std::__cxx11::string::~string((string *)&nameAnim);
    local_100 = local_100 + 1;
  }
  return;
}

Assistant:

void glTF2Exporter::ExportAnimations()
{
    Ref<Buffer> bufferRef = mAsset->buffers.Get(unsigned (0));

    for (unsigned int i = 0; i < mScene->mNumAnimations; ++i) {
        const aiAnimation* anim = mScene->mAnimations[i];
        const float ticksPerSecond = static_cast<float>(anim->mTicksPerSecond);

        std::string nameAnim = "anim";
        if (anim->mName.length > 0) {
            nameAnim = anim->mName.C_Str();
        }

        for (unsigned int channelIndex = 0; channelIndex < anim->mNumChannels; ++channelIndex) {
            const aiNodeAnim* nodeChannel = anim->mChannels[channelIndex];

            // It appears that assimp stores this type of animation as multiple animations.
            // where each aiNodeAnim in mChannels animates a specific node.
            std::string name = nameAnim + "_" + to_string(channelIndex);
            name = mAsset->FindUniqueID(name, "animation");
            Ref<Animation> animRef = mAsset->animations.Create(name);

            Ref<Node> animNode = mAsset->nodes.Get(nodeChannel->mNodeName.C_Str());

            Animation::Sampler translationSampler;
            ExtractTranslationSampler(*mAsset, name, bufferRef, nodeChannel, ticksPerSecond, translationSampler);
            AddSampler(animRef, animNode, translationSampler, AnimationPath_TRANSLATION);

            Animation::Sampler rotationSampler;
            ExtractRotationSampler(*mAsset, name, bufferRef, nodeChannel, ticksPerSecond, rotationSampler);
            AddSampler(animRef, animNode, rotationSampler, AnimationPath_ROTATION);

            Animation::Sampler scaleSampler;
            ExtractScaleSampler(*mAsset, name, bufferRef, nodeChannel, ticksPerSecond, scaleSampler);
            AddSampler(animRef, animNode, scaleSampler, AnimationPath_SCALE);
        }

        // Assimp documentation staes this is not used (not implemented)
        // for (unsigned int channelIndex = 0; channelIndex < anim->mNumMeshChannels; ++channelIndex) {
        //     const aiMeshAnim* meshChannel = anim->mMeshChannels[channelIndex];
        // }

    } // End: for-loop mNumAnimations
}